

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::twoSidedJacobiRotation<float,0,2,1>
               (Matrix33<float> *A,Matrix33<float> *U,Matrix33<float> *V,float tol)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  int __x;
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar4;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float tau2_1;
  float tau1_1;
  float tau2;
  float tau1;
  float d_2;
  float d_1;
  float s_1;
  float c_1;
  float t_2;
  float rho_2;
  float s_2;
  float c_2;
  float rho;
  float r;
  float p;
  float s;
  float c;
  float mu_2;
  float mu_1;
  bool changed;
  float z;
  float y;
  float x;
  float w;
  float local_64;
  float local_5c;
  float local_58;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  pfVar3 = Matrix33<float>::operator[](in_RDI,0);
  fVar9 = *pfVar3;
  pfVar3 = Matrix33<float>::operator[](in_RDI,0);
  fVar1 = pfVar3[2];
  pfVar3 = Matrix33<float>::operator[](in_RDI,2);
  fVar7 = *pfVar3;
  pMVar4 = in_RDI;
  pfVar3 = Matrix33<float>::operator[](in_RDI,2);
  fVar8 = pfVar3[2];
  bVar2 = false;
  __x = (int)pMVar4;
  std::abs(__x);
  std::abs(__x);
  if (in_XMM0_Da * extraout_XMM0_Da_00 < extraout_XMM0_Da) {
    local_44 = (fVar9 + fVar8) / (fVar1 - fVar7);
    dVar10 = std::sqrt((double)(ulong)(uint)(local_44 * local_44 + 1.0));
    local_48 = 1.0 / SUB84(dVar10,0);
    if (local_44 < 0.0) {
      local_48 = -local_48;
    }
    local_44 = local_48 * local_44;
    local_3c = local_48 * (fVar1 + fVar7) + local_44 * (fVar8 - fVar9);
    local_40 = (local_44 * fVar1 + -(local_48 * fVar8)) * 2.0;
    bVar2 = true;
  }
  else {
    local_44 = 1.0;
    local_48 = 0.0;
    local_3c = fVar8 - fVar9;
    local_40 = fVar1 + fVar7;
  }
  std::abs(__x);
  std::abs(__x);
  if (in_XMM0_Da * extraout_XMM0_Da_02 < extraout_XMM0_Da_01) {
    local_3c = local_3c / local_40;
    std::abs(__x);
    dVar10 = std::sqrt((double)(ulong)(uint)(local_3c * local_3c + 1.0));
    local_64 = 1.0 / (extraout_XMM0_Da_03 + SUB84(dVar10,0));
    if (local_3c < 0.0) {
      local_64 = -local_64;
    }
    dVar10 = std::sqrt((double)(ulong)(uint)(local_64 * local_64 + 1.0));
    local_58 = 1.0 / SUB84(dVar10,0);
    local_5c = local_58 * local_64;
    bVar2 = true;
  }
  else {
    local_58 = 1.0;
    local_5c = 0.0;
  }
  fVar5 = local_58 * local_44 + -(local_5c * local_48);
  fVar6 = local_5c * local_44 + local_58 * local_48;
  if (bVar2) {
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    *pfVar3 = fVar5 * (fVar9 * local_58 + -(fVar1 * local_5c)) +
              -(fVar6 * (fVar7 * local_58 + -(fVar8 * local_5c)));
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    pfVar3[2] = fVar6 * (fVar9 * local_5c + fVar1 * local_58) +
                fVar5 * (fVar7 * local_5c + fVar8 * local_58);
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    *pfVar3 = 0.0;
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar3[2] = 0.0;
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    fVar9 = pfVar3[1];
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    fVar1 = pfVar3[1];
    fVar7 = fVar5 * fVar9 + -(fVar6 * fVar1);
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar3[1] = fVar7;
    fVar8 = fVar6 * fVar9 + fVar5 * fVar1;
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    pfVar3[1] = fVar8;
    pfVar3 = Matrix33<float>::operator[](in_RDI,1);
    fVar9 = *pfVar3;
    pfVar3 = Matrix33<float>::operator[](in_RDI,1);
    fVar1 = pfVar3[2];
    fVar5 = local_58 * fVar9 + -(local_5c * fVar1);
    pfVar3 = Matrix33<float>::operator[](in_RDI,1);
    *pfVar3 = fVar5;
    fVar9 = local_5c * fVar9 + local_58 * fVar1;
    pfVar3 = Matrix33<float>::operator[](in_RDI,1);
    pfVar3[2] = fVar9;
    jacobiRotateRight<float,0,2>((Matrix33<float> *)CONCAT44(fVar9,fVar5),fVar8,fVar7);
    jacobiRotateRight<float,0,2>((Matrix33<float> *)CONCAT44(fVar9,fVar5),fVar8,fVar7);
  }
  else {
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    *pfVar3 = 0.0;
    pfVar3 = Matrix33<float>::operator[](in_RDI,0);
    pfVar3[2] = 0.0;
  }
  return bVar2;
}

Assistant:

bool
twoSidedJacobiRotation (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
    const T                                tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs (mu_2) <=
        tol * std::abs (mu_1)) // Already symmetric (to tolerance)
    {                          // Note that the <= is important here
        c = T (1);             // because we want to bypass the computation
        s = T (0);             // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1      = r - p;
        mu_2      = x + y;
    }
    else
    {
        // TODO is there a native inverse square root function?
        const T rho = mu_1 / mu_2;

        s = T (1) / std::sqrt (T (1) + rho * rho);
        if (rho < 0) s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w); // = r - p
        mu_2 = T (2) * (c * x - s * z);   // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs (mu_2) <= tol * std::abs (mu_1))
    {
        c_2 = T (1);
        s_2 = T (0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T (1) / (std::abs (rho_2) + std::sqrt (1 + rho_2 * rho_2));
        if (rho_2 < 0) t_2 = -t_2;
        c_2 = T (1) / std::sqrt (T (1) + t_2 * t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1 * (w * c_2 - x * s_2) - s_1 * (y * c_2 - z * s_2);
    const T d_2 = s_1 * (w * s_2 + x * c_2) + c_1 * (y * s_2 + z * c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    {
        // Rotate on the left by
        //    [  c1 s1 0 ]^T      [  c1 0 s1 ]^T      [ 1   0  0 ]^T
        //    [ -s1 c1 0 ]    or  [   0 1  0 ]    or  [ 0  c1 s1 ]
        //    [   0  0 1 ]        [ -s1 0 c1 ]        [ 0 -s1 c1 ]
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l]      = c_1 * tau1 - s_1 * tau2;
        A[k][l]      = s_1 * tau1 + c_1 * tau2;
    }

    {
        // Rotate on the right by
        //    [  c2 s2 0 ]      [  c2 0 s2 ]      [ 1   0  0 ]
        //    [ -s2 c2 0 ]  or  [   0 1  0 ]  or  [ 0  c2 s2 ]
        //    [   0  0 1 ]      [ -s2 0 c2 ]      [ 0 -s2 c2 ]
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j]      = c_2 * tau1 - s_2 * tau2;
        A[l][k]      = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight<T, j, k> (U, c_1, s_1);
    jacobiRotateRight<T, j, k> (V, c_2, s_2);

    return true;
}